

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O2

BVIndex __thiscall BVFixed::Count(BVFixed *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  uint uVar5;
  BVIndex i;
  ulong uVar6;
  BVFixed *this_00;
  
  this_00 = this + 1;
  uVar6 = 0;
  uVar5 = 0;
  while( true ) {
    BVar3 = WordCount(this);
    if (BVar3 <= uVar6) break;
    BVar3 = BVUnitT<unsigned_long>::Count((BVUnitT<unsigned_long> *)this_00);
    uVar5 = uVar5 + BVar3;
    uVar6 = uVar6 + 1;
    this_00 = this_00 + 1;
  }
  if (this->len < uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                       ,0x141,"(sum <= this->Length())","sum <= this->Length()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return uVar5;
}

Assistant:

BVIndex
BVFixed::Count() const
{
    BVIndex sum = 0;
    for (BVIndex i=0; i < this->WordCount(); i++)
    {
        sum += this->data[i].Count();
    }
    Assert(sum <= this->Length());
    return sum;
}